

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O2

void list_store_delete(t_list_store *x,t_floatarg f1,t_floatarg f2)

{
  int *piVar1;
  int iVar2;
  t_listelem *ptVar3;
  uint uVar4;
  ulong uVar5;
  t_listelem *ptVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  
  uVar9 = (uint)f1;
  if (((int)uVar9 < 0) ||
     (iVar2 = (x->x_alist).l_n, uVar4 = iVar2 - uVar9, uVar4 == 0 || iVar2 < (int)uVar9)) {
    pd_error(x,"list_store_delete: index %d out of range",(ulong)uVar9);
    return;
  }
  uVar7 = (uint)f2;
  uVar8 = uVar7;
  if ((int)uVar4 < (int)uVar7) {
    uVar8 = uVar4;
  }
  if ((int)uVar7 < 0) {
    uVar8 = uVar4;
  }
  ptVar3 = (x->x_alist).l_vec;
  uVar11 = 1;
  if (uVar7 != 0) {
    uVar11 = uVar8;
  }
  ptVar6 = ptVar3;
  if ((x->x_alist).l_npointer != 0) {
    lVar10 = 0;
    uVar5 = 0;
    if (0 < (int)uVar11) {
      uVar5 = (ulong)uVar11;
    }
    for (; uVar5 * 0x28 - lVar10 != 0; lVar10 = lVar10 + 0x28) {
      if (*(int *)((long)&ptVar3[uVar9].l_a.a_type + lVar10) == 3) {
        gpointer_unset(*(t_gpointer **)((long)&ptVar3[uVar9].l_a.a_w + lVar10));
        piVar1 = &(x->x_alist).l_npointer;
        *piVar1 = *piVar1 + -1;
      }
    }
    ptVar6 = (x->x_alist).l_vec;
    uVar4 = (x->x_alist).l_n - uVar9;
  }
  memmove(ptVar6 + uVar9,ptVar6 + uVar9 + (int)uVar11,(long)(int)uVar4 * 0x28);
  lVar10 = (long)(x->x_alist).l_n;
  ptVar6 = (t_listelem *)resizebytes((x->x_alist).l_vec,lVar10 * 0x28,(lVar10 - (int)uVar11) * 0x28)
  ;
  (x->x_alist).l_vec = ptVar6;
  if (ptVar6 != (t_listelem *)0x0) {
    if ((x->x_alist).l_npointer != 0) {
      uVar4 = 0;
      if (ptVar6 == ptVar3) {
        uVar4 = uVar9;
      }
      alist_restore_gpointers(&x->x_alist,uVar4,((x->x_alist).l_n - uVar11) - uVar4);
    }
    piVar1 = &(x->x_alist).l_n;
    *piVar1 = *piVar1 - uVar11;
    return;
  }
  (x->x_alist).l_n = 0;
  pd_error((void *)0x0,"list: out of memory");
  return;
}

Assistant:

static void list_store_delete(t_list_store *x, t_floatarg f1, t_floatarg f2)
{
    int i, max, index = (int)f1, n = (int)f2;
    t_listelem *oldptr = x->x_alist.l_vec;
    if (index < 0 || index >= x->x_alist.l_n)
    {
        pd_error(x, "list_store_delete: index %d out of range", index);
        return;
    }
    max = x->x_alist.l_n - index;
    if (!n)
        n = 1; /* default */
    else if (n < 0 || n > max)
        n = max; /* till the end of the list */

        /* unset pointers for elements which are to be deleted */
    if (x->x_alist.l_npointer)
    {
        t_listelem *vec = x->x_alist.l_vec + index;
        for (i = 0; i < n; i++)
        {
            if (vec[i].l_a.a_type == A_POINTER)
            {
                gpointer_unset(vec[i].l_a.a_w.w_gpointer);
                x->x_alist.l_npointer--;
            }
        }
    }
        /* shift elements (after the deleted elements) to the left */
    memmove(x->x_alist.l_vec + index, x->x_alist.l_vec + index + n,
        (x->x_alist.l_n - index) * sizeof(*x->x_alist.l_vec));
        /* shrink memory */
    if (!(x->x_alist.l_vec = (t_listelem *)resizebytes(x->x_alist.l_vec,
        (x->x_alist.l_n) * sizeof(*x->x_alist.l_vec),
        (x->x_alist.l_n - n) * sizeof(*x->x_alist.l_vec))))
    {
        x->x_alist.l_n = 0;
        pd_error(0, "list: out of memory");
        return;
    }
    if (x->x_alist.l_npointer)
    {
            /* fix all gpointers in case resizebytes() has moved the alist in memory */
        if (x->x_alist.l_vec != oldptr)
            alist_restore_gpointers(&x->x_alist, 0, x->x_alist.l_n - n);
        else /* only fix gpointers after index (because of of memmove()) */
            alist_restore_gpointers(&x->x_alist, index, x->x_alist.l_n - index - n);
    }
    x->x_alist.l_n -= n;
}